

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  uint uVar1;
  PlatformInterface *pPVar2;
  uint uVar3;
  VkDeviceSize VVar4;
  VkPhysicalDeviceProperties *pVVar5;
  VkAllocationCallbacks *pVVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  Unique<vk::Handle<(vk::HandleType)7>_> *ptr;
  Parameters *params_00;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  objects;
  Parameters params_local;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_1d8;
  AllocationCallbackRecorder allocRecorder;
  
  params_local.memoryTypeIndex = (deUint32)params.size;
  params_local.size = (VkDeviceSize)context;
  VVar4 = getPageTableSize((Context *)this,(VkDeviceSize)context);
  pVVar5 = Context::getDeviceProperties((Context *)this);
  uVar1 = (pVVar5->limits).maxMemoryAllocationCount;
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocRecorder,pVVar6,0x400);
  pPVar2 = *(PlatformInterface **)(this + 8);
  pDVar7 = Context::getDeviceInterface((Context *)this);
  pVVar8 = Context::getDevice((Context *)this);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  params_00 = *(Parameters **)(this + 0x10);
  env.allocationCallbacks =
       &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar2;
  env.vkd = pDVar7;
  env.device = pVVar8;
  env.programBinaries = (BinaryCollection *)params_00;
  sVar9 = getCurrentSystemMemoryUsage(&allocRecorder);
  DeviceMemory::create
            ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_1d8,&env,(Resources *)&params_local,
             params_00);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8.m_data.deleter.m_device;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8.m_data.object.m_internal;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1d8.m_data.deleter.m_deviceIface;
  local_1d8.m_data.object.m_internal = 0;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_1d8);
  sVar10 = getCurrentSystemMemoryUsage(&allocRecorder);
  uVar3 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar3 = uVar1;
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&objects);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocRecorder);
  sVar9 = getSafeObjectCount((Context *)this,sVar10 - sVar9,(long)&context->m_testCtx + VVar4);
  if (uVar3 < sVar9) {
    sVar9 = (ulong)uVar3;
  }
  Environment::Environment(&env,(Context *)this,(deUint32)sVar9);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector(&objects,sVar9,(allocator_type *)&allocRecorder);
  allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       *(_func_int ***)(*(long *)this + 0x10);
  pVVar6 = &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pVVar6);
  std::operator<<((ostream *)pVVar6,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)pVVar6);
  std::operator<<((ostream *)pVVar6," ");
  pcVar11 = ::vk::getTypeName<vk::Handle<(vk::HandleType)7>>();
  std::operator<<((ostream *)pVVar6,pcVar11);
  std::operator<<((ostream *)pVVar6," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocRecorder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pVVar6);
  lVar13 = 0;
  for (uVar12 = 0; sVar9 != uVar12; uVar12 = uVar12 + 1) {
    ptr = (Unique<vk::Handle<(vk::HandleType)7>_> *)operator_new(0x20);
    DeviceMemory::create
              ((Move<vk::Handle<(vk::HandleType)7>_> *)&allocRecorder,&env,
               (Resources *)&params_local,params_00);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_device =
         (VkDevice)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
         (deUint64)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
         (void *)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
         (PFN_vkAllocationFunction)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation =
         (PFN_vkReallocationFunction)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)&local_1d8,ptr)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&allocRecorder);
    bVar14 = (uVar12 & 0x3ff) != 0;
    params_00 = (Parameters *)CONCAT71((int7)((ulong)params_00 >> 8),bVar14 || uVar12 == 0);
    if (!bVar14 && uVar12 != 0) {
      tcu::TestContext::touchWatchdog(*(TestContext **)this);
    }
    lVar13 = lVar13 + 0x10;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocRecorder,"Ok",(allocator<char> *)&local_1d8);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&allocRecorder);
  std::__cxx11::string::~string((string *)&allocRecorder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector(&objects);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}